

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O1

void __thiscall InlineeFrameRecord::Dump(InlineeFrameRecord *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  ulong uVar7;
  
  do {
    pcVar5 = Js::ParseableFunctionInfo::GetExternalDisplayName
                       (&this->functionBody->super_ParseableFunctionInfo);
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
    pFVar1 = this->functionBody;
    if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    Output::Print(L"%s [#%u.%u] args:",pcVar5,(ulong)uVar4,
                  (ulong)((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                         )->functionId);
    if (this->argCount != 0) {
      uVar7 = 0;
      do {
        DumpOffset(this,this->argOffsets[uVar7]);
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar7);
        pcVar5 = L"f ";
        if (((this->floatArgs).word >> (uVar7 & 0x3f) & 1) == 0) {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar7);
          pcVar5 = L"i ";
          if (((this->losslessInt32Args).word & 1L << ((byte)uVar7 & 0x3f)) != 0) goto LAB_00562478;
        }
        else {
LAB_00562478:
          Output::Print(pcVar5);
        }
        Output::Print(L", ");
        uVar7 = uVar7 + 1;
      } while (uVar7 < this->argCount);
    }
    InlineeFrameInfo::Dump(this->frameInfo);
    Output::Print(L"func: ");
    DumpOffset(this,this->functionOffset);
    this = this->parent;
    if (this == (InlineeFrameRecord *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void InlineeFrameRecord::Dump() const
{
    Output::Print(_u("%s [#%u.%u] args:"), this->functionBody->GetExternalDisplayName(), this->functionBody->GetSourceContextId(), this->functionBody->GetLocalFunctionId());
    for (uint i = 0; i < argCount; i++)
    {
        DumpOffset(argOffsets[i]);
        if (floatArgs.Test(i))
        {
            Output::Print(_u("f "));
        }
        else if (losslessInt32Args.Test(i))
        {
            Output::Print(_u("i "));
        }
        Output::Print(_u(", "));
    }
    this->frameInfo->Dump();

    Output::Print(_u("func: "));
    DumpOffset(functionOffset);

    if (this->parent)
    {
        parent->Dump();
    }
}